

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdump.c
# Opt level: O0

int main(int argc,char **argv)

{
  vtt_block_t *cue_00;
  caption_frame_t *in_stack_00000170;
  size_t in_stack_ffffffffffffe178;
  caption_frame_t *frame_00;
  vtt_block_t *cue;
  vtt_t *vtt;
  utf8_char_t *data;
  size_t size;
  caption_frame_t frame;
  char **argv_local;
  int argc_local;
  
  if (1 < argc) {
    utf8_load_text_file((char *)frame.timestamp,(size_t *)size);
    cue_00 = (vtt_block_t *)vtt_parse((utf8_char_t *)cue,in_stack_ffffffffffffe178);
    for (frame_00 = (caption_frame_t *)cue_00->cue_settings; frame_00 != (caption_frame_t *)0x0;
        frame_00 = (caption_frame_t *)frame_00->timestamp) {
      caption_frame_init((caption_frame_t *)0x1032d8);
      vtt_cue_to_caption_frame(cue_00,frame_00);
      caption_frame_dump(in_stack_00000170);
    }
    vtt_free((vtt_t *)0x103316);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    caption_frame_t frame;

    if (argc < 2) {
        return 0;
    }

    size_t size;
    utf8_char_t* data = utf8_load_text_file(argv[1], &size);

    vtt_t* vtt = vtt_parse(data, size);

    for (vtt_block_t* cue = vtt->cue_head; cue != NULL; cue = cue->next) {
        caption_frame_init(&frame);
        vtt_cue_to_caption_frame(cue, &frame);
        caption_frame_dump(&frame);
    }

    vtt_free(vtt);
}